

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::ShouldGenerateStringReplaceFastPath(Lowerer *this,Instr *callInstr,IntConstType argCount)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  SymOpnd *pSVar6;
  StackSym *pSVar7;
  Opnd *this_00;
  undefined8 uStack_38;
  
  this_00 = callInstr->m_src2;
  uStack_38 = in_RAX;
  if (argCount == 2) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4fa9,"(argCount == 2)","argCount == 2");
    if (!bVar3) {
LAB_00575718:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  while (bVar3 = IR::Opnd::IsSymOpnd(this_00), bVar3) {
    pSVar6 = IR::Opnd::AsSymOpnd(this_00);
    pSVar7 = Sym::AsStackSym(pSVar6->m_sym);
    if ((pSVar7->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4faf,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar4) goto LAB_00575718;
      *puVar5 = 0;
    }
    pIVar1 = (pSVar7->field_5).m_instrDef;
    if (argCount < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4fb2,"(argCount >= 0)","argCount >= 0");
      if (!bVar4) goto LAB_00575718;
      *puVar5 = 0;
    }
    if ((argCount & 0xfffffffffffffffdU) == 0) {
      uStack_38 = CONCAT26((pIVar1->m_src1->m_valueType).field_0.bits,(undefined6)uStack_38);
      bVar4 = ValueType::IsLikelyString((ValueType *)((long)&uStack_38 + 6));
      if (!bVar4) break;
    }
    if ((argCount == 1) && (bVar4 = IR::Opnd::IsTaggedInt(pIVar1->m_src1), bVar4)) break;
    argCount = argCount - 1;
    this_00 = pIVar1->m_src2;
  }
  return !bVar3;
}

Assistant:

bool
Lowerer::ShouldGenerateStringReplaceFastPath(IR::Instr * callInstr, IntConstType argCount)
{
    // a.replace(b,c)
    // We want to emit the fast path if 'a' and 'c' are strings and 'b' is a regex
    //
    // argout sequence:
    // arg1(s12)<0>.var = ArgOut_A       s2.var, s11.var                         #0014   <---- a
    // arg2(s13)<4>.var = ArgOut_A       s3.var, arg1(s12)<0>.var                #0018   <---- b
    // arg3(s14)<8>.var = ArgOut_A       s4.var, arg2(s13)<4>.var                #001c   <---- c
    // s0[LikelyString].var = CallI      s5[ffunc].var, arg3(s14)<8>.var         #0020

    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    Assert(argCount == 2);

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd *src2 = linkOpnd->AsSymOpnd();
        StackSym *sym = src2->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;

        Assert(argCount >= 0);
        // check to see if 'a' and 'c' are likely strings
        if((argCount == 2 || argCount == 0) && (!argInstr->GetSrc1()->GetValueType().IsLikelyString()))
        {
            return false;
        }
        // we want 'b' to be regex. Don't generate fastpath if it is a tagged int
        if((argCount == 1) && (argInstr->GetSrc1()->IsTaggedInt()))
        {
            return false;
        }
        argCount--;
        linkOpnd = argInstr->GetSrc2();
    }
    return true;
}